

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O0

void __thiscall
WorldShuffler::randomize_oracle_stone_hint(WorldShuffler *this,Item *forbidden_fortune_teller_item)

{
  allocator<Item_*> *this_00;
  RandomizerWorld *pRVar1;
  initializer_list<Item_*> __l;
  json_value end_node;
  bool bVar2;
  uint16_t uVar3;
  HintSource *pHVar4;
  Item *item_00;
  reference ppIVar5;
  string *psVar6;
  WorldNode *start_node;
  Json *json;
  LandstalkerException *this_01;
  reference ppIVar7;
  ostream *poVar8;
  allocator<char> local_509;
  string local_508;
  int local_4e8;
  uint8_t local_4e2;
  uint8_t local_4e1;
  string local_4e0;
  string local_4c0;
  stringstream local_4a0 [8];
  stringstream oracle_stone_hint;
  ostream local_490 [376];
  __normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_> local_318;
  Item *local_310;
  Item *hinted_item;
  Item *item_1;
  iterator __end2;
  iterator __begin2;
  vector<Item_*,_std::allocator<Item_*>_> *__range2;
  vector<Item_*,_std::allocator<Item_*>_> hintable_items;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  Item *local_280;
  Item *item;
  iterator __end4;
  iterator __begin4;
  vector<Item_*,_std::allocator<Item_*>_> *__range4;
  vector<Item_*,_std::allocator<Item_*>_> min_items_to_reach;
  undefined1 local_230 [8];
  WorldSolver solver;
  WorldNode *first_source_node;
  vector<ItemSource_*,_std::allocator<ItemSource_*>_> sources;
  HintSource *local_d0;
  Item *local_c8;
  Item *local_c0;
  Item *local_b8;
  Item *local_b0;
  Item *local_a8;
  HintSource **local_a0;
  size_type local_98;
  undefined1 local_90 [8];
  vector<Item_*,_std::allocator<Item_*>_> forbidden_items;
  allocator<char> local_41;
  string local_40;
  HintSource *local_20;
  HintSource *oracle_stone_source;
  Item *forbidden_fortune_teller_item_local;
  WorldShuffler *this_local;
  
  pRVar1 = this->_world;
  oracle_stone_source = (HintSource *)forbidden_fortune_teller_item;
  forbidden_fortune_teller_item_local = (Item *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Oracle Stone",&local_41);
  pHVar4 = RandomizerWorld::hint_source(pRVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  local_20 = pHVar4;
  HintSource::text_abi_cxx11_
            ((string *)
             &forbidden_items.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,pHVar4);
  bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &forbidden_items.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &forbidden_items.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    uVar3 = RandomizerWorld::item_quantity(this->_world,'0');
    if (uVar3 != 0) {
      RandomizerWorld::add_used_hint_source(this->_world,local_20);
      local_d0 = oracle_stone_source;
      local_c8 = World::item(&this->_world->super_World,'(');
      local_c0 = World::item(&this->_world->super_World,'*');
      local_b8 = World::item(&this->_world->super_World,'4');
      local_b0 = World::item(&this->_world->super_World,'!');
      local_a8 = World::item(&this->_world->super_World,'\"');
      local_a0 = &local_d0;
      local_98 = 6;
      this_00 = (allocator<Item_*> *)
                ((long)&sources.super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      std::allocator<Item_*>::allocator(this_00);
      __l._M_len = local_98;
      __l._M_array = (iterator)local_a0;
      std::vector<Item_*,_std::allocator<Item_*>_>::vector
                ((vector<Item_*,_std::allocator<Item_*>_> *)local_90,__l,this_00);
      std::allocator<Item_*>::~allocator
                ((allocator<Item_*> *)
                 ((long)&sources.super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      pRVar1 = this->_world;
      item_00 = World::item(&pRVar1->super_World,'0');
      RandomizerWorld::item_sources_with_item
                ((vector<ItemSource_*,_std::allocator<ItemSource_*>_> *)&first_source_node,pRVar1,
                 item_00);
      pRVar1 = this->_world;
      ppIVar5 = std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>::at
                          ((vector<ItemSource_*,_std::allocator<ItemSource_*>_> *)&first_source_node
                           ,0);
      psVar6 = ItemSource::node_id_abi_cxx11_(*ppIVar5);
      solver._debug_log.m_value.object = (object_t *)RandomizerWorld::node(pRVar1,psVar6);
      if ((WorldNode *)solver._debug_log.m_value.object != (WorldNode *)0x0) {
        WorldSolver::WorldSolver((WorldSolver *)local_230,this->_world);
        start_node = RandomizerWorld::spawn_node(this->_world);
        end_node = solver._debug_log.m_value;
        World::starting_inventory
                  ((vector<Item_*,_std::allocator<Item_*>_> *)
                   &min_items_to_reach.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,&this->_world->super_World);
        bVar2 = WorldSolver::try_to_solve
                          ((WorldSolver *)local_230,start_node,(WorldNode *)end_node.object,
                           (vector<Item_*,_std::allocator<Item_*>_> *)
                           &min_items_to_reach.super__Vector_base<Item_*,_std::allocator<Item_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<Item_*,_std::allocator<Item_*>_>::~vector
                  ((vector<Item_*,_std::allocator<Item_*>_> *)
                   &min_items_to_reach.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        if (!bVar2) {
          json = WorldSolver::debug_log_abi_cxx11_(&this->_solver);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2a0,"./debug.json",&local_2a1);
          dump_json_to_file(json,&local_2a0);
          std::__cxx11::string::~string((string *)&local_2a0);
          std::allocator<char>::~allocator(&local_2a1);
          hintable_items.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
          this_01 = (LandstalkerException *)__cxa_allocate_exception(0x28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2c8,"Could not find minimal inventory to reach Oracle Stone",
                     (allocator<char> *)
                     ((long)&hintable_items.super__Vector_base<Item_*,_std::allocator<Item_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          LandstalkerException::LandstalkerException(this_01,&local_2c8);
          hintable_items.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
          __cxa_throw(this_01,&LandstalkerException::typeinfo,
                      LandstalkerException::~LandstalkerException);
        }
        WorldSolver::find_minimal_inventory
                  ((vector<Item_*,_std::allocator<Item_*>_> *)&__range4,(WorldSolver *)local_230);
        __end4 = std::vector<Item_*,_std::allocator<Item_*>_>::begin
                           ((vector<Item_*,_std::allocator<Item_*>_> *)&__range4);
        item = (Item *)std::vector<Item_*,_std::allocator<Item_*>_>::end
                                 ((vector<Item_*,_std::allocator<Item_*>_> *)&__range4);
        while (bVar2 = __gnu_cxx::operator==<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_>
                                 (&__end4,(__normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_>
                                           *)&item), ((bVar2 ^ 0xffU) & 1) != 0) {
          ppIVar7 = __gnu_cxx::
                    __normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_>::
                    operator*(&__end4);
          local_280 = *ppIVar7;
          bVar2 = vectools::contains<Item*>
                            ((vector<Item_*,_std::allocator<Item_*>_> *)local_90,&local_280);
          if (!bVar2) {
            std::vector<Item*,std::allocator<Item*>>::emplace_back<Item*&>
                      ((vector<Item*,std::allocator<Item*>> *)local_90,&local_280);
          }
          __gnu_cxx::__normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_>::
          operator++(&__end4);
        }
        std::vector<Item_*,_std::allocator<Item_*>_>::~vector
                  ((vector<Item_*,_std::allocator<Item_*>_> *)&__range4);
        WorldSolver::~WorldSolver((WorldSolver *)local_230);
      }
      std::vector<Item_*,_std::allocator<Item_*>_>::vector
                ((vector<Item_*,_std::allocator<Item_*>_> *)&__range2);
      __end2 = std::vector<Item_*,_std::allocator<Item_*>_>::begin
                         (&this->_minimal_items_to_complete);
      item_1 = (Item *)std::vector<Item_*,_std::allocator<Item_*>_>::end
                                 (&this->_minimal_items_to_complete);
      while (bVar2 = __gnu_cxx::operator==<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_>
                               (&__end2,(__normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_>
                                         *)&item_1), ((bVar2 ^ 0xffU) & 1) != 0) {
        ppIVar7 = __gnu_cxx::
                  __normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_>::
                  operator*(&__end2);
        hinted_item = *ppIVar7;
        bVar2 = vectools::contains<Item*>
                          ((vector<Item_*,_std::allocator<Item_*>_> *)local_90,&hinted_item);
        if (!bVar2) {
          std::vector<Item*,std::allocator<Item*>>::emplace_back<Item*&>
                    ((vector<Item*,std::allocator<Item*>> *)&__range2,&hinted_item);
        }
        __gnu_cxx::__normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_>::
        operator++(&__end2);
      }
      bVar2 = std::vector<Item_*,_std::allocator<Item_*>_>::empty
                        ((vector<Item_*,_std::allocator<Item_*>_> *)&__range2);
      if (bVar2) {
        local_4e8 = 0;
      }
      else {
        vectools::shuffle<Item*>((vector<Item_*,_std::allocator<Item_*>_> *)&__range2,&this->_rng);
        local_318._M_current =
             (Item **)std::vector<Item_*,_std::allocator<Item_*>_>::begin
                                ((vector<Item_*,_std::allocator<Item_*>_> *)&__range2);
        ppIVar7 = __gnu_cxx::
                  __normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_>::
                  operator*(&local_318);
        local_310 = *ppIVar7;
        std::__cxx11::stringstream::stringstream(local_4a0);
        poVar8 = std::operator<<(local_490,"You will need ");
        psVar6 = Item::name_abi_cxx11_(local_310);
        poVar8 = std::operator<<(poVar8,(string *)psVar6);
        poVar8 = std::operator<<(poVar8,". It is ");
        random_hint_for_item_abi_cxx11_(&local_4c0,this,local_310);
        poVar8 = std::operator<<(poVar8,(string *)&local_4c0);
        std::operator<<(poVar8,".");
        std::__cxx11::string::~string((string *)&local_4c0);
        pHVar4 = local_20;
        std::__cxx11::stringstream::str();
        HintSource::text(pHVar4,&local_4e0);
        std::__cxx11::string::~string((string *)&local_4e0);
        local_4e1 = Item::id(local_310);
        vectools::erase_first<unsigned_char>(&this->_hintable_item_requirements,&local_4e1);
        local_4e2 = Item::id(local_310);
        vectools::erase_first<unsigned_char>(&this->_hintable_item_locations,&local_4e2);
        local_4e8 = 1;
        std::__cxx11::stringstream::~stringstream(local_4a0);
      }
      std::vector<Item_*,_std::allocator<Item_*>_>::~vector
                ((vector<Item_*,_std::allocator<Item_*>_> *)&__range2);
      std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>::~vector
                ((vector<ItemSource_*,_std::allocator<ItemSource_*>_> *)&first_source_node);
      std::vector<Item_*,_std::allocator<Item_*>_>::~vector
                ((vector<Item_*,_std::allocator<Item_*>_> *)local_90);
      if (local_4e8 != 0) {
        return;
      }
    }
    pHVar4 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_508,
               "The stone looks blurry. It looks like it won\'t be of any use...",&local_509);
    HintSource::text(pHVar4,&local_508);
    std::__cxx11::string::~string((string *)&local_508);
    std::allocator<char>::~allocator(&local_509);
  }
  else {
    RandomizerWorld::add_used_hint_source(this->_world,local_20);
  }
  return;
}

Assistant:

void WorldShuffler::randomize_oracle_stone_hint(Item* forbidden_fortune_teller_item)
{
    HintSource* oracle_stone_source = _world.hint_source("Oracle Stone");

    // If hint source already contains text (e.g. through plando descriptor), ignore it
    if(!oracle_stone_source->text().empty())
    {
        _world.add_used_hint_source(oracle_stone_source);
        return;
    }

    if(_world.item_quantity(ITEM_ORACLE_STONE) > 0)
    {
        _world.add_used_hint_source(oracle_stone_source);

        std::vector<Item*> forbidden_items = {
                forbidden_fortune_teller_item, _world.item(ITEM_RED_JEWEL), _world.item(ITEM_PURPLE_JEWEL),
                _world.item(ITEM_GREEN_JEWEL), _world.item(ITEM_BLUE_JEWEL), _world.item(ITEM_YELLOW_JEWEL)
        };

        // Also excluding items strictly needed to get to Oracle Stone's location
        std::vector<ItemSource*> sources = _world.item_sources_with_item(_world.item(ITEM_ORACLE_STONE));
        WorldNode* first_source_node = _world.node(sources.at(0)->node_id());
        if(first_source_node)
        {
            WorldSolver solver(_world);
            if(solver.try_to_solve(_world.spawn_node(), first_source_node, _world.starting_inventory()))
            {
                std::vector<Item*> min_items_to_reach = solver.find_minimal_inventory();
                for(Item* item : min_items_to_reach)
                    if(!vectools::contains(forbidden_items, item))
                        forbidden_items.emplace_back(item);
            }
            else
            {
                dump_json_to_file(_solver.debug_log(), "./debug.json");
                throw LandstalkerException("Could not find minimal inventory to reach Oracle Stone");
            }
        }

        std::vector<Item*> hintable_items;
        for(Item* item : _minimal_items_to_complete)
        {
            if(!vectools::contains(forbidden_items, item))
                hintable_items.emplace_back(item);
        }

        if(!hintable_items.empty())
        {
            vectools::shuffle(hintable_items, _rng);
            Item* hinted_item = *hintable_items.begin();

            std::stringstream oracle_stone_hint;
            oracle_stone_hint << "You will need " << hinted_item->name() << ". It is "
                              << this->random_hint_for_item(hinted_item) << ".";
            oracle_stone_source->text(oracle_stone_hint.str());

            vectools::erase_first(_hintable_item_requirements, hinted_item->id());
            vectools::erase_first(_hintable_item_locations, hinted_item->id());
            return;
        }
    }

    oracle_stone_source->text("The stone looks blurry. It looks like it won't be of any use...");
}